

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
* __thiscall
libtorrent::aux::torrent::get_piece_layers
          (vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           *__return_storage_ptr__,torrent *this)

{
  bool bVar1;
  vector<sha256_hash> local_58;
  reference local_40;
  merkle_tree *tree;
  const_iterator __end2;
  const_iterator __begin2;
  vector<aux::merkle_tree,_file_index_t> *__range2;
  torrent *this_local;
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  *ret;
  
  ::std::
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  ::vector(__return_storage_ptr__);
  __end2 = ::std::
           vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
           begin(&(this->m_merkle_trees).
                  super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                );
  tree = (merkle_tree *)
         ::std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
         ::end(&(this->m_merkle_trees).
                super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
              );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                                     *)&tree), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
               ::operator*(&__end2);
    merkle_tree::get_piece_layer(&local_58,local_40);
    ::std::
    vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
    ::
    emplace_back<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
              ((vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
                *)__return_storage_ptr__,&local_58);
    container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
    ::~container_wrapper(&local_58);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::merkle_tree_*,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<sha256_hash>> torrent::get_piece_layers() const
	{
		std::vector<std::vector<sha256_hash>> ret;
		for (auto const& tree : m_merkle_trees)
			ret.emplace_back(tree.get_piece_layer());
		return ret;
	}